

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  Classifier CVar4;
  int iVar5;
  Option *pOVar6;
  ulong uVar7;
  App *this_00;
  string dummy2;
  string dummy1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar5 = ::std::__cxx11::string::compare((char *)current);
  if (iVar5 == 0) {
    CVar4 = POSITIONAL_MARK;
    goto LAB_0011ee65;
  }
  bVar3 = _valid_subcommand(this,current,ignore_used_subcommands);
  CVar4 = SUBCOMMAND;
  if (bVar3) goto LAB_0011ee65;
  bVar3 = detail::split_long(current,&local_70,&local_90);
  CVar4 = LONG;
  if (bVar3) goto LAB_0011ee65;
  if (((current->_M_string_length < 2) || (pcVar2 = (current->_M_dataplus)._M_p, *pcVar2 != '-')) ||
     (bVar1 = pcVar2[1], bVar1 < 0x22 || bVar1 == 0x2d)) {
    if (this->allow_windows_style_options_ == true) {
      bVar3 = detail::split_windows_style(current,&local_70,&local_90);
      CVar4 = WINDOWS_STYLE;
      if (bVar3) goto LAB_0011ee65;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)current);
    if (((iVar5 == 0) && ((this->name_)._M_string_length != 0)) &&
       (CVar4 = SUBCOMMAND_TERMINATOR, this->parent_ != (App *)0x0)) goto LAB_0011ee65;
    uVar7 = ::std::__cxx11::string::find((char)current,0x2e);
    if (uVar7 != 0xffffffffffffffff) {
      ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
      this_00 = _find_subcommand(this,&local_b0,true,ignore_used_subcommands);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (this_00 == (App *)0x0) {
        bVar3 = true;
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
        CVar4 = _recognize(this_00,&local_b0,ignore_used_subcommands);
        uVar7 = (ulong)CVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        bVar3 = CVar4 != SUBCOMMAND;
      }
      CVar4 = (Classifier)uVar7;
      if (!bVar3) goto LAB_0011ee65;
    }
LAB_0011efa6:
    CVar4 = NONE;
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)current);
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (((byte)(*local_70._M_dataplus._M_p - 0x30U) < 10) ||
       (((*local_70._M_dataplus._M_p == 0x2e && (local_90._M_string_length != 0)) &&
        ((byte)(*local_90._M_dataplus._M_p - 0x30U) < 10)))) {
      local_50.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)*local_70._M_dataplus._M_p << 8 | 0x2d;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pOVar6 = get_option_no_throw(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (pOVar6 == (Option *)0x0) goto LAB_0011efa6;
    }
    CVar4 = SHORT;
  }
LAB_0011ee65:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return CVar4;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE detail::Classifier App::_recognize(const std::string &current,
                                                                bool ignore_used_subcommands) const {
    std::string dummy1, dummy2;

    if(current == "--")
        return detail::Classifier::POSITIONAL_MARK;
    if(_valid_subcommand(current, ignore_used_subcommands))
        return detail::Classifier::SUBCOMMAND;
    if(detail::split_long(current, dummy1, dummy2))
        return detail::Classifier::LONG;
    if(detail::split_short(current, dummy1, dummy2)) {
        if((dummy1[0] >= '0' && dummy1[0] <= '9') ||
           (dummy1[0] == '.' && !dummy2.empty() && (dummy2[0] >= '0' && dummy2[0] <= '9'))) {
            // it looks like a number but check if it could be an option
            if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                return detail::Classifier::NONE;
            }
        }
        return detail::Classifier::SHORT;
    }
    if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
        return detail::Classifier::WINDOWS_STYLE;
    if((current == "++") && !name_.empty() && parent_ != nullptr)
        return detail::Classifier::SUBCOMMAND_TERMINATOR;
    auto dotloc = current.find_first_of('.');
    if(dotloc != std::string::npos) {
        auto *cm = _find_subcommand(current.substr(0, dotloc), true, ignore_used_subcommands);
        if(cm != nullptr) {
            auto res = cm->_recognize(current.substr(dotloc + 1), ignore_used_subcommands);
            if(res == detail::Classifier::SUBCOMMAND) {
                return res;
            }
        }
    }
    return detail::Classifier::NONE;
}